

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool google::protobuf::internal::MergeFromImpl<false>
               (ZeroCopyInputStream *input,MessageLite *msg,ParseFlags parse_flags)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ParseFlags parse_flags_00;
  undefined1 local_b0 [8];
  ParseContext ctx;
  ZeroCopyInputStream *input_local;
  char *ptr;
  
  ctx.data_.factory = (MessageFactory *)input;
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&>
            ((ParseContext *)local_b0,io::CodedInputStream::default_recursion_limit_,false,
             (char **)&input_local,(ZeroCopyInputStream **)&ctx.data_.factory);
  iVar2 = (*msg->_vptr_MessageLite[0xb])(msg,input_local,(ParseContext *)local_b0);
  input_local = (ZeroCopyInputStream *)CONCAT44(extraout_var,iVar2);
  bVar1 = false;
  if ((input_local != (ZeroCopyInputStream *)0x0) &&
     (bVar1 = false, (int)ctx.super_EpsCopyInputStream.aliasing_ == 1)) {
    bVar1 = anon_unknown_17::CheckFieldPresence
                      ((ParseContext *)msg,(MessageLite *)(ulong)parse_flags,parse_flags_00);
  }
  return bVar1;
}

Assistant:

bool MergeFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has no explicit limit (hence we end on end of stream)
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtEndOfStream())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}